

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O0

double __thiscall
singular::Svd<60,_50>::BidiagonalMatrix::operator()(BidiagonalMatrix *this,int i,int j)

{
  bool local_31;
  bool local_21;
  int j_local;
  int i_local;
  BidiagonalMatrix *this_local;
  
  local_21 = 0x3b < (uint)i;
  if (local_21) {
    __assert_fail("i >= 0 && i < M",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kikuomax[P]singular/src/singular/Svd.h"
                  ,0xf8,
                  "double singular::Svd<60, 50>::BidiagonalMatrix::operator()(int, int) const [M = 60, N = 50]"
                 );
  }
  local_31 = 0x31 < (uint)j;
  if (local_31) {
    __assert_fail("j >= 0 && j < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kikuomax[P]singular/src/singular/Svd.h"
                  ,0xf9,
                  "double singular::Svd<60, 50>::BidiagonalMatrix::operator()(int, int) const [M = 60, N = 50]"
                 );
  }
  if (i == j) {
    this_local = (BidiagonalMatrix *)this->pBlock[i << 1];
  }
  else if (i + 1 == j) {
    this_local = (BidiagonalMatrix *)this->pBlock[i * 2 + 1];
  }
  else {
    this_local = (BidiagonalMatrix *)0x0;
  }
  return (double)this_local;
}

Assistant:

double operator ()(int i, int j) const {
				assert(i >= 0 && i < M);
				assert(j >= 0 && j < N);
				if (i == j) {
					return this->pBlock[2 * i];
				} else if (i + 1 == j) {
					return this->pBlock[2 * i + 1];
				} else {
					return 0.0;
				}
			}